

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

bool duckdb_yyjson::unsafe_yyjson_equals(yyjson_val *lhs,yyjson_val *rhs)

{
  void *__s2;
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  ulong uVar4;
  char *pcVar5;
  byte bVar6;
  char *pcVar7;
  byte bVar8;
  ulong __n;
  yyjson_val *pyVar9;
  ulong uVar10;
  ulong uVar11;
  yyjson_val *pyVar12;
  yyjson_val *pyVar13;
  yyjson_val *pyVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  
  uVar4 = lhs->tag;
  bVar6 = (byte)uVar4 & 7;
  uVar11 = rhs->tag;
  if (bVar6 == ((byte)uVar11 & 7)) {
    switch(bVar6) {
    case 0:
      break;
    default:
      if (uVar4 >> 8 == uVar11 >> 8) {
        iVar2 = bcmp((lhs->uni).ptr,(rhs->uni).ptr,uVar4 >> 8);
        return iVar2 == 0;
      }
      break;
    case 2:
    case 3:
      return uVar4 == uVar11;
    case 4:
      bVar8 = (byte)uVar4 & 0x18;
      bVar6 = (byte)uVar11 & 0x18;
      if (bVar8 == bVar6) {
        uVar3 = (lhs->uni).u64;
LAB_01f2f9fa:
        return uVar3 == (rhs->uni).u64;
      }
      if (bVar8 == 8 && (uVar11 & 0x18) == 0) {
        uVar3 = (lhs->uni).i64;
        if (-1 < (long)uVar3) goto LAB_01f2f9fa;
      }
      else if (((uVar4 & 0x18) == 0 && bVar6 == 8) && (-1 < (rhs->uni).i64)) {
        return (lhs->uni).u64 == (rhs->uni).i64;
      }
      break;
    case 6:
      uVar10 = uVar4 >> 8;
      if (uVar10 == uVar11 >> 8) {
        if (uVar4 < 0x100) {
          return true;
        }
        pyVar12 = lhs + 1;
        pyVar9 = rhs + 1;
        while( true ) {
          bVar17 = uVar10 == 0;
          uVar10 = uVar10 - 1;
          if (bVar17) {
            return bVar17;
          }
          bVar1 = unsafe_yyjson_equals(pyVar12,pyVar9);
          if (!bVar1) break;
          pcVar5 = (char *)0x10;
          if ((~(uint)pyVar12->tag & 6) == 0) {
            pcVar5 = (pyVar12->uni).str;
          }
          pcVar7 = (char *)0x10;
          if ((~(uint)pyVar9->tag & 6) == 0) {
            pcVar7 = (pyVar9->uni).str;
          }
          pyVar12 = (yyjson_val *)(pcVar5 + (long)&pyVar12->tag);
          pyVar9 = (yyjson_val *)(pcVar7 + (long)&pyVar9->tag);
        }
        return bVar17;
      }
      break;
    case 7:
      uVar10 = uVar4 >> 8;
      if (uVar10 == uVar11 >> 8) {
        if (0xff < uVar4) {
          pyVar12 = rhs + 1;
          pyVar13 = lhs + 1;
          uVar4 = uVar10;
          pyVar9 = pyVar12;
          uVar11 = 0;
          while( true ) {
            bVar17 = uVar4 == 0;
            uVar4 = uVar4 - 1;
            if (bVar17) break;
            __s2 = (pyVar13->uni).ptr;
            if (__s2 == (void *)0x0) {
              return false;
            }
            uVar16 = uVar11;
            if (uVar11 == uVar10) {
              uVar16 = 0;
              pyVar9 = pyVar12;
            }
            __n = pyVar13->tag >> 8;
            pyVar14 = pyVar9;
            uVar15 = uVar10;
            while( true ) {
              if (uVar15 <= uVar16) {
                return false;
              }
              pcVar5 = (char *)0x10;
              if ((~(uint)pyVar14[1].tag & 6) == 0) {
                pcVar5 = pyVar14[1].uni.str;
              }
              uVar16 = uVar16 + 1;
              pyVar9 = (yyjson_val *)(pcVar5 + (long)pyVar14 + 0x10);
              if ((pyVar14->tag >> 8 == __n) &&
                 (iVar2 = bcmp((pyVar14->uni).ptr,__s2,__n), iVar2 == 0)) break;
              pyVar14 = pyVar9;
              if (uVar11 < uVar10 && uVar16 == uVar10) {
                uVar16 = 0;
                pyVar14 = pyVar12;
                uVar15 = uVar11;
              }
            }
            bVar1 = unsafe_yyjson_equals(pyVar13 + 1,pyVar14 + 1);
            if (!bVar1) {
              return bVar17;
            }
            pcVar5 = (char *)0x10;
            if ((~(uint)pyVar13[1].tag & 6) == 0) {
              pcVar5 = pyVar13[1].uni.str;
            }
            pyVar13 = (yyjson_val *)(pcVar5 + (long)&pyVar13[1].tag);
            uVar11 = uVar16;
          }
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool unsafe_yyjson_equals(yyjson_val *lhs, yyjson_val *rhs) {
    yyjson_type type = unsafe_yyjson_get_type(lhs);
    if (type != unsafe_yyjson_get_type(rhs)) return false;

    switch (type) {
        case YYJSON_TYPE_OBJ: {
            usize len = unsafe_yyjson_get_len(lhs);
            if (len != unsafe_yyjson_get_len(rhs)) return false;
            if (len > 0) {
                yyjson_obj_iter iter;
                yyjson_obj_iter_init(rhs, &iter);
                lhs = unsafe_yyjson_get_first(lhs);
                while (len-- > 0) {
                    rhs = yyjson_obj_iter_getn(&iter, lhs->uni.str,
                                               unsafe_yyjson_get_len(lhs));
                    if (!rhs) return false;
                    if (!unsafe_yyjson_equals(lhs + 1, rhs)) return false;
                    lhs = unsafe_yyjson_get_next(lhs + 1);
                }
            }
            /* yyjson allows duplicate keys, so the check may be inaccurate */
            return true;
        }

        case YYJSON_TYPE_ARR: {
            usize len = unsafe_yyjson_get_len(lhs);
            if (len != unsafe_yyjson_get_len(rhs)) return false;
            if (len > 0) {
                lhs = unsafe_yyjson_get_first(lhs);
                rhs = unsafe_yyjson_get_first(rhs);
                while (len-- > 0) {
                    if (!unsafe_yyjson_equals(lhs, rhs)) return false;
                    lhs = unsafe_yyjson_get_next(lhs);
                    rhs = unsafe_yyjson_get_next(rhs);
                }
            }
            return true;
        }

        case YYJSON_TYPE_NUM:
            return unsafe_yyjson_num_equals(lhs, rhs);

        case YYJSON_TYPE_RAW:
        case YYJSON_TYPE_STR:
            return unsafe_yyjson_str_equals(lhs, rhs);

        case YYJSON_TYPE_NULL:
        case YYJSON_TYPE_BOOL:
            return lhs->tag == rhs->tag;

        default:
            return false;
    }
}